

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindExtension
          (DescriptorIndex *this,StringPiece containing_type,int field_number)

{
  pointer pEVar1;
  int iVar2;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  this_00;
  void *pvVar3;
  size_t __n;
  ulong uVar4;
  char *__s2;
  StringPiece SVar5;
  pair<const_void_*,_int> pVar6;
  tuple<google::protobuf::stringpiece_internal::StringPiece,_int> local_40;
  
  __s2 = containing_type.ptr_;
  EnsureFlat(this);
  local_40.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)field_number;
  local_40.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Head_base<0UL,_google::protobuf::stringpiece_internal::StringPiece,_false>._M_head_impl.
  ptr_ = __s2;
  local_40.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Head_base<0UL,_google::protobuf::stringpiece_internal::StringPiece,_false>._M_head_impl.
  length_ = containing_type.length_;
  this_00 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::tuple<google::protobuf::stringpiece_internal::StringPiece,int>,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>>
                      ((this->by_extension_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->by_extension_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40,
                       (_Iter_comp_val<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                        )(this->by_extension_)._M_t._M_impl.
                         super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                         ._M_key_compare.index);
  if (this_00._M_current !=
      (this->by_extension_flat_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SVar5 = ExtensionEntry::extendee(this_00._M_current,this);
    __n = SVar5.length_;
    if (__n == containing_type.length_) {
      if (__n != 0 && SVar5.ptr_ != __s2) {
        iVar2 = bcmp(SVar5.ptr_,__s2,__n);
        if (iVar2 != 0) goto LAB_0038ad26;
      }
      if ((this_00._M_current)->extension_number == field_number) {
        pEVar1 = (this->all_values_).
                 super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = pEVar1[(this_00._M_current)->data_offset].data;
        uVar4 = (ulong)(uint)pEVar1[(this_00._M_current)->data_offset].size;
        goto LAB_0038ad2a;
      }
    }
  }
LAB_0038ad26:
  pvVar3 = (void *)0x0;
  uVar4 = 0;
LAB_0038ad2a:
  pVar6._8_8_ = uVar4;
  pVar6.first = pvVar3;
  return pVar6;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindExtension(
    StringPiece containing_type, int field_number) {
  EnsureFlat();

  auto it = std::lower_bound(
      by_extension_flat_.begin(), by_extension_flat_.end(),
      std::make_tuple(containing_type, field_number), by_extension_.key_comp());
  return it == by_extension_flat_.end() ||
                 it->extendee(*this) != containing_type ||
                 it->extension_number != field_number
             ? std::make_pair(nullptr, 0)
             : all_values_[it->data_offset].value();
}